

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

bool __thiscall
llvm::yaml::Input::preflightKey
          (Input *this,char *Key,bool Required,bool param_3,bool *UseDefault,void **SaveInfo)

{
  uint uVar1;
  Child CVar2;
  size_t sVar3;
  error_category *peVar4;
  NodeKind LHSKind;
  Child CVar5;
  HNode *pHVar6;
  Child CVar7;
  pair<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_bool>
  pVar8;
  StringRef Key_00;
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  NodeKind local_b0;
  char cStack_af;
  undefined6 uStack_ae;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  NodeKind local_98;
  char cStack_97;
  undefined6 uStack_96;
  uint local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  NodeKind local_80;
  char cStack_7f;
  undefined6 uStack_7e;
  Child local_78;
  undefined8 uStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Input *local_50;
  Child local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  *UseDefault = false;
  if ((this->EC)._M_value != 0) {
    return false;
  }
  pHVar6 = this->CurrentNode;
  if (pHVar6 == (HNode *)0x0) {
    if (!Required) {
      return false;
    }
    peVar4 = (error_category *)std::_V2::generic_category();
    (this->EC)._M_value = 0x16;
    (this->EC)._M_cat = peVar4;
    return false;
  }
  uVar1 = pHVar6->_node->TypeID;
  if (uVar1 != 4) {
    if (uVar1 == 0 && !Required) {
      return false;
    }
    Twine::Twine((Twine *)&local_78,"not a mapping");
    goto LAB_00dc5049;
  }
  local_50 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78.character,Key,(allocator<char> *)&local_48.character);
  SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::push_back((SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               *)(pHVar6 + 3),
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.twine != &local_68) {
    operator_delete(local_78.twine,local_68._M_allocated_capacity + 1);
  }
  if (Key == (char *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = strlen(Key);
  }
  Key_00.Length = sVar3;
  Key_00.Data = Key;
  pVar8 = StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
          ::try_emplace<>((StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
                           *)(pHVar6 + 1),Key_00);
  pHVar6 = *(HNode **)
            (*(long *)pVar8.first.
                      super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                      .Ptr.
                      super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
            + 8);
  if (pHVar6 != (HNode *)0x0) {
    *SaveInfo = local_50->CurrentNode;
    local_50->CurrentNode = pHVar6;
    return true;
  }
  if (!Required) {
    *UseDefault = true;
    return false;
  }
  pHVar6 = local_50->CurrentNode;
  Twine::Twine((Twine *)&local_c0,"missing required key \'");
  Twine::Twine((Twine *)&local_a8,Key);
  if ((local_b0 == NullKind) || (local_98 == NullKind)) {
    local_48.twine = (Twine *)0x0;
    uStack_40 = 0;
    local_38 = CONCAT62(local_38._2_6_,0x100);
  }
  else {
    if (local_b0 == EmptyKind) {
      local_38 = CONCAT62(uStack_96,CONCAT11(cStack_97,local_98));
    }
    else {
      if (local_98 != EmptyKind) {
        CVar2._4_4_ = uStack_bc;
        CVar2.decUI = local_c0;
        if (cStack_af != '\x01') {
          local_b0 = TwineKind;
          CVar2.twine = (Twine *)&local_c0;
        }
        if (cStack_97 != '\x01') {
          local_98 = TwineKind;
        }
        CVar5._4_4_ = uStack_a4;
        CVar5.decUI = local_a8;
        CVar7.twine = (Twine *)&local_a8;
        if (cStack_97 == '\x01') {
          CVar7 = CVar5;
        }
        Twine::Twine((Twine *)&local_48,CVar2,local_b0,CVar7,local_98);
        goto LAB_00dc4f9d;
      }
      local_38 = CONCAT62(uStack_ae,CONCAT11(cStack_af,local_b0));
      local_a8 = local_c0;
      uStack_a4 = uStack_bc;
      uStack_a0 = uStack_b8;
      uStack_9c = uStack_b4;
    }
    local_48._4_4_ = uStack_a4;
    local_48.decUI = local_a8;
    uStack_40 = CONCAT44(uStack_9c,uStack_a0);
  }
LAB_00dc4f9d:
  Twine::Twine((Twine *)&local_90,"\'");
  this = local_50;
  if (((NodeKind)local_38 == NullKind) || (local_80 == NullKind)) {
    local_78.twine = (Twine *)0x0;
    uStack_70 = 0;
    local_68._M_allocated_capacity._0_2_ = 0x100;
  }
  else {
    if ((NodeKind)local_38 == EmptyKind) {
      local_68._M_allocated_capacity = CONCAT62(uStack_7e,CONCAT11(cStack_7f,local_80));
    }
    else {
      if (local_80 != EmptyKind) {
        CVar2 = local_48;
        LHSKind = (NodeKind)local_38;
        if (local_38._1_1_ != '\x01') {
          CVar2.twine = (Twine *)&local_48;
          LHSKind = TwineKind;
        }
        if (cStack_7f != '\x01') {
          local_80 = TwineKind;
        }
        CVar7._4_4_ = uStack_8c;
        CVar7.decUI = local_90;
        CVar5.twine = (Twine *)&local_90;
        if (cStack_7f == '\x01') {
          CVar5 = CVar7;
        }
        Twine::Twine((Twine *)&local_78,CVar2,LHSKind,CVar5,local_80);
        this = local_50;
        goto LAB_00dc5049;
      }
      local_68._M_allocated_capacity = local_38;
      local_90 = local_48.decUI;
      uStack_8c = local_48._4_4_;
      uStack_88 = (undefined4)uStack_40;
      uStack_84 = uStack_40._4_4_;
    }
    local_78._4_4_ = uStack_8c;
    local_78.decUI = local_90;
    uStack_70 = CONCAT44(uStack_84,uStack_88);
  }
LAB_00dc5049:
  setError(this,pHVar6,(Twine *)&local_78);
  return false;
}

Assistant:

bool Input::preflightKey(const char *Key, bool Required, bool, bool &UseDefault,
                         void *&SaveInfo) {
  UseDefault = false;
  if (EC)
    return false;

  // CurrentNode is null for empty documents, which is an error in case required
  // nodes are present.
  if (!CurrentNode) {
    if (Required)
      EC = make_error_code(errc::invalid_argument);
    return false;
  }

  MapHNode *MN = dyn_cast<MapHNode>(CurrentNode);
  if (!MN) {
    if (Required || !isa<EmptyHNode>(CurrentNode))
      setError(CurrentNode, "not a mapping");
    return false;
  }
  MN->ValidKeys.push_back(Key);
  HNode *Value = MN->Mapping[Key].get();
  if (!Value) {
    if (Required)
      setError(CurrentNode, Twine("missing required key '") + Key + "'");
    else
      UseDefault = true;
    return false;
  }
  SaveInfo = CurrentNode;
  CurrentNode = Value;
  return true;
}